

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get<std::__cxx11::string>
          (Attribute *this,double t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  anon_struct_8_0_00000001_for___align local_78;
  long local_68;
  undefined8 uStack_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if (dst == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return false;
  }
  if ((NAN(t)) &&
     ((((this->_var)._blocked != false ||
       (pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0)) ||
      ((uVar3 = (*pvVar1->type_id)(), uVar3 != 0 &&
       ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
        (uVar3 = (*pvVar1->type_id)(), uVar3 != 1)))))))) {
    primvar::PrimVar::get_value<std::__cxx11::string>(&local_58,&this->_var);
    if (local_58.has_value_ == true) {
      if (local_58.contained.data.__align ==
          (anon_struct_8_0_00000001_for___align)((long)&local_58.contained + 0x10)) {
        uStack_60 = local_58.contained._24_8_;
        local_78 = (anon_struct_8_0_00000001_for___align)&local_68;
      }
      else {
        local_78 = local_58.contained.data.__align;
      }
      local_68 = local_58.contained._16_8_;
      std::__cxx11::string::_M_assign((string *)dst);
    }
    if (((local_58.has_value_ & 1U) != 0) &&
       (local_78 != (anon_struct_8_0_00000001_for___align)&local_68)) {
      operator_delete((void *)local_78,local_68 + 1);
    }
    if (local_58.has_value_ != false) {
      return true;
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = get_value<std::__cxx11::string>(this,dst);
  }
  else {
    bVar2 = primvar::PrimVar::get_interpolated_value<std::__cxx11::string>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar2;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }